

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2product1<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  int iVar1;
  uint uVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Real eps;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  uint *puVar13;
  undefined4 *puVar14;
  Item *pIVar15;
  byte bVar16;
  cpp_dec_float<200U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  nzval;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t local_34;
  
  bVar16 = 0;
  iVar1 = *(x->super_IdxSet).idx;
  pnVar3 = (x->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = 0x1c;
  puVar11 = (uint *)(pnVar3 + iVar1);
  puVar13 = (uint *)&nzval;
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar13 = *puVar11;
    puVar11 = puVar11 + 1;
    puVar13 = puVar13 + 1;
  }
  nzval.m_backend.exp = pnVar3[iVar1].m_backend.exp;
  nzval.m_backend.neg = pnVar3[iVar1].m_backend.neg;
  nzval.m_backend.fpclass = pnVar3[iVar1].m_backend.fpclass;
  nzval.m_backend.prec_elem = pnVar3[iVar1].m_backend.prec_elem;
  pIVar15 = (A->set).theitem + (A->set).thekey[iVar1].idx;
  puVar11 = (uint *)&nzval;
  puVar13 = local_b0;
  for (; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar13 = *puVar11;
    puVar11 = puVar11 + 1;
    puVar13 = puVar13 + 1;
  }
  local_40 = nzval.m_backend.exp;
  local_3c = nzval.m_backend.neg;
  local_38 = nzval.m_backend.fpclass;
  local_34 = nzval.m_backend.prec_elem;
  eps = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
  bVar5 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_b0,eps);
  if (!bVar5) {
    uVar2 = (pIVar15->data).
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused;
    uVar10 = (ulong)uVar2;
    if (uVar10 != 0) {
      *(uint *)(this + 8) = uVar2;
      lVar8 = uVar10 * 0x84;
      while (0 < (int)uVar10) {
        pNVar4 = (pIVar15->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        *(undefined4 *)(*(long *)(this + 0x10) + -4 + uVar10 * 4) =
             *(undefined4 *)((long)(&pNVar4[-1].val + 1) + lVar8);
        uVar10 = uVar10 - 1;
        local_1b8.fpclass = cpp_dec_float_finite;
        local_1b8.prec_elem = 0x1c;
        local_1b8.data._M_elems[0] = 0;
        local_1b8.data._M_elems[1] = 0;
        local_1b8.data._M_elems[2] = 0;
        local_1b8.data._M_elems[3] = 0;
        local_1b8.data._M_elems[4] = 0;
        local_1b8.data._M_elems[5] = 0;
        local_1b8.data._M_elems[6] = 0;
        local_1b8.data._M_elems[7] = 0;
        local_1b8.data._M_elems[8] = 0;
        local_1b8.data._M_elems[9] = 0;
        local_1b8.data._M_elems[10] = 0;
        local_1b8.data._M_elems[0xb] = 0;
        local_1b8.data._M_elems[0xc] = 0;
        local_1b8.data._M_elems[0xd] = 0;
        local_1b8.data._M_elems[0xe] = 0;
        local_1b8.data._M_elems[0xf] = 0;
        local_1b8.data._M_elems[0x10] = 0;
        local_1b8.data._M_elems[0x11] = 0;
        local_1b8.data._M_elems[0x12] = 0;
        local_1b8.data._M_elems[0x13] = 0;
        local_1b8.data._M_elems[0x14] = 0;
        local_1b8.data._M_elems[0x15] = 0;
        local_1b8.data._M_elems[0x16] = 0;
        local_1b8.data._M_elems[0x17] = 0;
        local_1b8.data._M_elems[0x18] = 0;
        local_1b8.data._M_elems[0x19] = 0;
        local_1b8.data._M_elems._104_5_ = 0;
        local_1b8.data._M_elems[0x1b]._1_3_ = 0;
        local_1b8.exp = 0;
        local_1b8.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_1b8,&nzval.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)((long)&pNVar4[-1].val.m_backend.data + lVar8))
        ;
        lVar7 = *(long *)(this + 0x20);
        lVar6 = (long)*(int *)((long)(&pNVar4[-1].val + 1) + lVar8) * 0x80;
        pcVar12 = &local_1b8;
        puVar14 = (undefined4 *)(lVar7 + lVar6);
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar14 = *(undefined4 *)pcVar12;
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar16 * -2 + 1) * 4)
          ;
          puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
        }
        *(int *)(lVar7 + 0x70 + lVar6) = local_1b8.exp;
        *(bool *)(lVar7 + 0x74 + lVar6) = local_1b8.neg;
        *(undefined8 *)(lVar7 + 0x78 + lVar6) = local_1b8._120_8_;
        lVar8 = lVar8 + -0x84;
      }
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2product1(const SVSetBase<S>& A, const SSVectorBase<T>& x)
{
   assert(x.isSetup());
   assert(x.size() == 1);

   // get the nonzero value of x and the corresponding vector in A:
   const int nzidx = x.idx[0];
   const T nzval = x.val[nzidx];
   const SVectorBase<S>& Ai = A[nzidx];

   // compute A[nzidx] * nzval:
   if(isZero(nzval, this->tolerances()->epsilon()) || Ai.size() == 0)
      clear();    // this := zero vector
   else
   {
      num = Ai.size();

      for(int j = num - 1; j >= 0; --j)
      {
         const Nonzero<S>& Aij = Ai.element(j);
         idx[j] = Aij.idx;
         VectorBase<R>::val[Aij.idx] = nzval * Aij.val;
      }
   }

   assert(isConsistent());

   return *this;
}